

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O2

size_t derTOCTDec(octet *val,size_t *len,octet *der,size_t count,u32 tag)

{
  size_t sVar1;
  size_t l;
  octet *v;
  size_t local_28;
  octet *local_20;
  
  sVar1 = derDec2(&local_20,&local_28,der,count,tag);
  if (sVar1 != 0xffffffffffffffff) {
    if (val != (octet *)0x0) {
      memMove(val,local_20,local_28);
    }
    if (len != (size_t *)0x0) {
      *len = local_28;
    }
  }
  return sVar1;
}

Assistant:

size_t derTOCTDec(octet* val, size_t* len, const octet der[], size_t count,
	u32 tag)
{
	const octet* v;
	size_t l;
	count = derDec2(&v, &l, der, count, tag);
	if (count == SIZE_MAX)
		return SIZE_MAX;
	if (val)
	{
		ASSERT(memIsValid(val, l));
		ASSERT(len == 0 || memIsDisjoint2(len, O_PER_S, val, l));
		memMove(val, v, l);
	}
	if (len)
	{
		ASSERT(memIsValid(len, O_PER_S));
		*len = l;
	}
	return count;
}